

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_actions.hpp
# Opt level: O0

void create(string *__title,
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__optional_params)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  pointer ppVar4;
  char *pcVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_RCX;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var9;
  __enable_if_t<is_constructible<value_type,_pair<const_char_*,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var10;
  byte local_952;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  allocator local_8f9;
  string local_8f8;
  string local_8d8;
  _frontmatter local_8b8;
  string local_7c0;
  int local_79c;
  undefined1 local_798 [4];
  int _exit_code;
  string local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  undefined1 local_6f8 [8];
  string __file_name;
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6c8;
  _Base_ptr local_6a0;
  undefined1 local_698;
  allocator local_689;
  string local_688;
  string local_668;
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_648;
  allocator local_619;
  string local_618;
  _Base_ptr local_5f8;
  undefined1 local_5f0;
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e8;
  _Base_ptr local_5c0;
  undefined1 local_5b8;
  allocator local_5a9;
  string local_5a8;
  string local_588;
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_568;
  allocator local_539;
  string local_538;
  string local_518;
  string local_4f8;
  undefined1 local_4d8 [8];
  string iso_date_string;
  key_type local_4b0;
  undefined1 local_490 [8];
  string full_iso_date_string;
  allocator local_459;
  string local_458;
  string local_438;
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_418;
  _Self local_3f0;
  allocator local_3e1;
  key_type local_3e0;
  _Self local_3c0;
  _Base_ptr local_3b8;
  undefined1 local_3b0;
  allocator local_3a1;
  string local_3a0;
  string local_380;
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  _Self local_338;
  allocator local_329;
  key_type local_328;
  _Self local_308;
  allocator local_2f9;
  key_type local_2f8;
  allocator local_2d1;
  key_type local_2d0;
  uint local_2ac;
  undefined1 local_2a8 [4];
  int publish_date;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  _Base_ptr local_248;
  _Base_ptr local_240;
  undefined1 local_238;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  _Base_ptr local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  _Base_ptr local_1c8;
  _Base_ptr local_1c0;
  byte local_1b1;
  string local_1b0;
  _Self local_180;
  undefined1 local_178 [8];
  string _value;
  string _key;
  iterator _trav;
  string _output_path;
  frontmatter __file;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__optional_params_local;
  string *__title_local;
  
  __file.__space.field_2._8_8_ = __optional_params;
  _frontmatter::_frontmatter((_frontmatter *)((long)&_output_path.field_2 + 8));
  std::__cxx11::string::string((string *)&_trav);
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(__optional_params);
  if (!bVar1) {
    _key.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin(__optional_params);
    std::__cxx11::string::string((string *)(_value.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_178);
    while( true ) {
      local_180._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(__optional_params);
      bVar1 = std::operator!=((_Self *)((long)&_key.field_2 + 8),&local_180);
      if (!bVar1) break;
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&_key.field_2 + 8));
      std::__cxx11::string::operator=((string *)(_value.field_2._M_local_buf + 8),(string *)ppVar4);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&_key.field_2 + 8));
      std::__cxx11::string::operator=((string *)local_178,(string *)&ppVar4->second);
      local_1b1 = 0;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&_value.field_2 + 8),"%fm_type");
      in_RCX._M_node = (_Base_ptr)CONCAT71((int7)((ulong)in_RCX._M_node >> 8),bVar1);
      local_952 = 0;
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_1b0,(string *)local_178);
        local_1b1 = 1;
        bVar1 = util::is_not_valid_fm_format(&local_1b0);
        local_952 = bVar1 ^ 0xff;
      }
      if ((local_1b1 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1b0);
      }
      if ((local_952 & 1) == 0) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&_value.field_2 + 8),"%output_path");
        if (bVar1) {
          std::__cxx11::string::operator=((string *)&_trav,(string *)local_178);
          local_1c8 = (_Base_ptr)
                      std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&_key.field_2 + 8),0);
        }
        else {
          pcVar5 = (char *)std::__cxx11::string::front();
          if (*pcVar5 == '%') {
            std::operator+(&local_1e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&_value.field_2 + 8)," is not an optional command parameter.");
            poVar8 = std::operator<<((ostream *)&std::cout,(string *)&local_1e8);
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_1e8);
            local_1f0 = (_Base_ptr)
                        std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)&_key.field_2 + 8),0);
          }
          else {
            std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
                      (&local_230,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&_value.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_178);
            _Var9 = std::
                    map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                              ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                *)(_output_path.field_2._M_local_buf + 8),&local_230);
            in_RCX = _Var9.first._M_node;
            local_238 = _Var9.second;
            local_240 = in_RCX._M_node;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(&local_230);
            local_248 = (_Base_ptr)
                        std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)&_key.field_2 + 8),0);
          }
        }
      }
      else {
        std::__cxx11::string::operator=((string *)&__file.categories_length,(string *)local_178);
        local_1c0 = (_Base_ptr)
                    std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)((long)&_key.field_2 + 8),0);
      }
    }
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string((string *)(_value.field_2._M_local_buf + 8));
  }
  uVar6 = std::__cxx11::string::length();
  if (0x40 < uVar6) {
    std::__cxx11::to_string((string *)local_2a8,0x40);
    std::operator+(&local_288,"Title exceeds character limit of ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
    std::operator+(&local_268,&local_288," characters.");
    exit_error_code(10,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)local_2a8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d0,"date",&local_2d1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&_output_path.field_2 + 8),&local_2d0);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  if ((bVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f8,"date",&local_2f9);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)((long)&_output_path.field_2 + 8),&local_2f8);
    local_2ac = std::__cxx11::stoi(pmVar7,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  }
  else {
    local_2ac = 0;
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&__file.categories_length,"YAML");
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&_trav,"./");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_328,"layout",&local_329);
  local_308._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&_output_path.field_2 + 8),&local_328);
  local_338._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&_output_path.field_2 + 8));
  bVar1 = std::operator==(&local_308,&local_338);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3a0,"What is the post layout in the frontmatter?",&local_3a1);
    util::prompt(&local_380,&local_3a0,0xffff);
    std::make_pair<char_const(&)[7],std::__cxx11::string>
              (&local_360,(char (*) [7])"layout",&local_380);
    _Var10 = std::
             map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             ::insert<std::pair<char_const*,std::__cxx11::string>>
                       ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                         *)(_output_path.field_2._M_local_buf + 8),&local_360);
    in_RCX = _Var10.first._M_node;
    local_3b0 = _Var10.second;
    local_3b8 = in_RCX._M_node;
    std::
    pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_360);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e0,"author",&local_3e1);
  local_3c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&_output_path.field_2 + 8),&local_3e0);
  local_3f0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&_output_path.field_2 + 8));
  bVar1 = std::operator==(&local_3c0,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_458,"Who is the author in the post?",&local_459);
    util::prompt(&local_438,&local_458,0xffff);
    std::make_pair<char_const(&)[7],std::__cxx11::string>
              (&local_418,(char (*) [7])"author",&local_438);
    _Var10 = std::
             map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             ::insert<std::pair<char_const*,std::__cxx11::string>>
                       ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                         *)(_output_path.field_2._M_local_buf + 8),&local_418);
    in_RCX = _Var10.first._M_node;
    full_iso_date_string.field_2._8_8_ = in_RCX._M_node;
    std::
    pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_418);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
  }
  util::get_current_formatted_date_string_abi_cxx11_
            ((string *)local_490,(util *)(ulong)local_2ac,0x141c53,(char *)in_RCX._M_node);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4b0,"date",(allocator *)(iso_date_string.field_2._M_local_buf + 0xf));
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)&_output_path.field_2 + 8),&local_4b0);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)(iso_date_string.field_2._M_local_buf + 0xf));
  util::get_current_formatted_date_string_abi_cxx11_
            ((string *)local_4d8,(util *)(ulong)local_2ac,0x141c5c,(char *)in_RCX._M_node);
  std::__cxx11::string::string((string *)&local_518,(string *)&_trav);
  util::check_dir_path(&local_4f8,&local_518);
  std::__cxx11::string::operator=((string *)&_trav,(string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_538,"How many categories for this post?",&local_539)
  ;
  __file.list._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
       util::prompt_int(&local_538,1,0x10);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5a8,"Categories",&local_5a9);
  util::prompt_arr(&local_588,&local_5a8,
                   (int)__file.list._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::make_pair<char_const(&)[11],std::__cxx11::string>
            (&local_568,(char (*) [11])"categories",&local_588);
  _Var10 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::insert<std::pair<char_const*,std::__cxx11::string>>
                     ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)(_output_path.field_2._M_local_buf + 8),&local_568);
  local_5c0 = (_Base_ptr)_Var10.first._M_node;
  local_5b8 = _Var10.second;
  std::
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_568);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  std::make_pair<char_const(&)[5],std::__cxx11::string&>
            (&local_5e8,(char (*) [5])0x1416f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_490);
  _Var10 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::insert<std::pair<char_const*,std::__cxx11::string>>
                     ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)(_output_path.field_2._M_local_buf + 8),&local_5e8);
  local_5f8 = (_Base_ptr)_Var10.first._M_node;
  local_5f0 = _Var10.second;
  std::
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_618,"How many tags for this post?",&local_619);
  __file.list._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       util::prompt_int(&local_618,1,0x10);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_688,"Tags",&local_689);
  util::prompt_arr(&local_668,&local_688,
                   __file.list._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  std::make_pair<char_const(&)[5],std::__cxx11::string>(&local_648,(char (*) [5])"tags",&local_668);
  _Var10 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::insert<std::pair<char_const*,std::__cxx11::string>>
                     ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)(_output_path.field_2._M_local_buf + 8),&local_648);
  local_6a0 = (_Base_ptr)_Var10.first._M_node;
  local_698 = _Var10.second;
  std::
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_648);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_688);
  std::allocator<char>::~allocator((allocator<char> *)&local_689);
  std::make_pair<char_const(&)[6],std::__cxx11::string&>(&local_6c8,(char (*) [6])"title",__title);
  _Var10 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::insert<std::pair<char_const*,std::__cxx11::string>>
                     ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)(_output_path.field_2._M_local_buf + 8),&local_6c8);
  __file_name.field_2._8_8_ = _Var10.first._M_node;
  std::
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_6c8);
  std::operator+(&local_758,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_trav,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8);
  std::operator+(&local_738,&local_758,"-");
  std::__cxx11::string::string((string *)local_798,(string *)__title);
  util::slugize_str(&local_778,(string *)local_798);
  std::operator+(&local_718,&local_738,&local_778);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f8,
                 &local_718,".md");
  std::__cxx11::string::~string((string *)&local_718);
  std::__cxx11::string::~string((string *)&local_778);
  std::__cxx11::string::~string((string *)local_798);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::string((string *)&local_7c0,(string *)local_6f8);
  _frontmatter::_frontmatter(&local_8b8,(_frontmatter *)((long)&_output_path.field_2 + 8));
  std::__cxx11::string::string((string *)&local_8d8,(string *)&__file.categories_length);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8f8,"write",&local_8f9);
  iVar3 = file_io::post_fm_write(&local_7c0,&local_8b8,&local_8d8,&local_8f8);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
  std::__cxx11::string::~string((string *)&local_8d8);
  _frontmatter::~_frontmatter(&local_8b8);
  std::__cxx11::string::~string((string *)&local_7c0);
  local_79c = iVar3;
  if (iVar3 == 0) {
    std::operator+(&local_940,"\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f8);
    std::operator+(&local_920,&local_940," successfully created.");
    poVar8 = std::operator<<((ostream *)&std::cout,(string *)&local_920);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_920);
    std::__cxx11::string::~string((string *)&local_940);
  }
  exit(local_79c);
}

Assistant:

void create(std::string __title, std::map<std::string, std::string> __optional_params) {
	frontmatter __file;
	std::string _output_path;

	// parsing through the options (--OPTION=VALUE)
	if (!__optional_params.empty()) {
		std::map<std::string, std::string>::iterator _trav = __optional_params.begin();

		std::string _key, _value;
		while (_trav != __optional_params.end()) {
			_key = _trav->first;
			_value = _trav->second;

			if (_key == FM_TYPE && !util::is_not_valid_fm_format(_value)) {
				__file.type = _value;
				_trav++;
				continue;
			}
			else if (_key == OUTPUT_PATH) {
				_output_path = _value;
				_trav++;
				continue;
			}
			else if (_key.front() == '%') {
				std::cout << _key + " is not an optional command parameter." << std::endl;
				_trav++;
				continue;
			}

			__file.list.insert(std::make_pair(_key, _value));
			_trav++;
		}
	}

    if (__title.length() > MAX_TITLE_LENGTH) {
        exit_error_code(10, "Title exceeds character limit of " + std::to_string(MAX_TITLE_LENGTH) +  " characters.");
	}
	
	// default parameters for the publish date
	int publish_date;
	if (__file.list["date"].empty())
		publish_date = 0;
	else
		publish_date = stoi(__file.list["date"]);
	
	// default parameters for the frontmatter format
	if (__file.type.empty())
		__file.type = "YAML";
	
	// default parameters for the path
	if (_output_path.empty())
		_output_path = "./";

	// prompting for layout when no given option
	if (__file.list.find("layout") == __file.list.end())
		__file.list.insert(std::make_pair("layout", util::prompt("What is the post layout in the frontmatter?")));

	// prompting for author when no given option
	if (__file.list.find("author") == __file.list.end())
		__file.list.insert(std::make_pair("author", util::prompt("Who is the author in the post?") ) );

	std::string full_iso_date_string = util::get_current_formatted_date_string(publish_date);
	__file.list.at("date") = full_iso_date_string;

	std::string iso_date_string = util::get_current_formatted_date_string(publish_date, "%F");
	_output_path = util::check_dir_path(_output_path);
	// Filling up the frontmatter with the necessary data
	
	__file.categories_length = util::prompt_int("How many categories for this post?", 1, MAX_ARR_LENGTH);
	__file.list.insert(std::make_pair("categories", util::prompt_arr("Categories", __file.categories_length) ));

	__file.list.insert(std::make_pair("date", full_iso_date_string));

	__file.tags_length = util::prompt_int("How many tags for this post?", 1, MAX_ARR_LENGTH);
	__file.list.insert(std::make_pair("tags", util::prompt_arr("Tags", __file.tags_length)));

	__file.list.insert(std::make_pair("title", __title));
	
    std::string __file_name = _output_path + iso_date_string + "-" + util::slugize_str(__title) + ".md";

	int _exit_code = file_io::post_fm_write(__file_name, __file, __file.type);
	if (_exit_code == 0)
		std::cout << "\n" + __file_name + " successfully created." << std::endl;
	exit(_exit_code);
}